

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O1

void __thiscall HashSet<String>::clear(HashSet<String> *this)

{
  String *this_00;
  
  for (this_00 = *(String **)(this + 8); this_00 != (String *)(this + 0x28);
      this_00 = (String *)this_00[1]._data.capacity) {
    String::~String(this_00);
    (this_00[1].data)->str = (char *)0x0;
    this_00[1]._data.len = *(usize *)(this + 0x70);
    *(String **)(this + 0x70) = this_00;
  }
  *(String **)(this + 8) = (String *)(this + 0x28);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      *i->cell = 0;
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }